

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall depspawn::internal::ThreadPool::main(ThreadPool *this)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  int my_id;
  unique_lock<std::mutex> my_lock;
  mutex_type *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  byte local_39;
  
  while (((*(byte *)((long)&in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1) ^ 0xff) & 1) != 0) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    while( true ) {
      local_39 = 0;
      if (((ulong)in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish & 1) == 0) {
        local_39 = *(byte *)((long)&in_RDI[6].
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1) ^ 0xff;
      }
      if ((local_39 & 1) == 0) break;
      std::condition_variable::wait
                ((unique_lock *)
                 &in_RDI[2].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    iVar1 = *(int *)((long)&in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start + 4);
    *(int *)((long)&in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start + 4) = iVar1 + 1;
    iVar2 = *(int *)((long)&in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start + 4);
    sVar3 = std::vector<std::thread,_std::allocator<std::thread>_>::size(in_RDI);
    if ((long)iVar2 == sVar3) {
      *(undefined1 *)
       &in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = 0;
    }
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    if ((((ulong)in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish & 0x100) == 0) &&
       (iVar1 < *(int *)&in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      std::function<void_()>::operator()
                ((function<void_()> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0))
      ;
    }
    do {
      in_stack_ffffffffffffffb7 = 0;
      if (((ulong)in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish & 1) != 0) {
        in_stack_ffffffffffffffb7 =
             *(byte *)((long)&in_RDI[6].
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                              super__Vector_impl_data._M_finish + 1) ^ 0xff;
      }
    } while ((in_stack_ffffffffffffffb7 & 1) != 0);
    std::unique_lock<std::mutex>::lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    *(int *)((long)&in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start + 4) =
         *(int *)((long)&in_RDI[6].super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4) + -1;
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  return;
}

Assistant:

void main()
  {
    while (!finish_) {
      std::unique_lock<std::mutex> my_lock(mutex_);
      while (!ready_ && !finish_) {
        cond_var_.wait(my_lock);
      }
      const int my_id = count_++;
      if(count_ == threads_.size()) {
        ready_ = false;
      }
      my_lock.unlock();

      if (!finish_ && (my_id < nthreads_in_use_)) {
        func_();
      }

      while(ready_ && !finish_) {} // ensure all threads restarted
      my_lock.lock();
      count_--;
      my_lock.unlock();

      //wait();
    }
  }